

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::insert
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t index,bool bit)

{
  subtree_ref t_00;
  subtree_const_ref t_01;
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  byte in_DL;
  int __c;
  EVP_PKEY_CTX *src;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_RSI;
  char *__s;
  size_t in_RDI;
  subtree_ref_base<false> in_stack_00000000;
  subtree_ref child_ref;
  size_t count;
  size_t end;
  size_t begin;
  size_t new_index;
  size_t child;
  subtree_ref old_root;
  word_type in_stack_fffffffffffffcf8;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_fffffffffffffd00;
  pair<unsigned_long,_unsigned_long> *in_stack_fffffffffffffd08;
  subtree_ref_base<false> *in_stack_fffffffffffffd10;
  subtree_ref_base<false> *in_stack_fffffffffffffd18;
  subtree_ref *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  size_t in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  subtree_ref_base<false> *this_00;
  bitview<bv::internal::bitarray_t<4096UL>::array> *in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd78;
  size_t in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_fffffffffffffd90;
  subtree_ref_base<false> in_stack_fffffffffffffda0;
  undefined1 local_220 [32];
  size_t in_stack_fffffffffffffe00;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_fffffffffffffe08;
  subtree_ref_base<false> *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe20;
  word_type in_stack_fffffffffffffe28;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_fffffffffffffe30;
  pair<unsigned_long,_unsigned_long> *in_stack_fffffffffffffe38;
  tuple<unsigned_long_&,_unsigned_long_&> *in_stack_fffffffffffffe40;
  subtree_ref_base<false> *in_stack_fffffffffffffe48;
  subtree_ref *in_stack_fffffffffffffe50;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *pbStack_1a8;
  undefined8 uStack_198;
  undefined8 local_190;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *local_170;
  tuple<unsigned_long_&,_unsigned_long_&,_unsigned_long_&> *ptStack_168;
  unsigned_long *puStack_160;
  size_t local_130;
  undefined1 in_stack_ffffffffffffffe7;
  undefined7 in_stack_ffffffffffffffe8;
  
  this_00 = (subtree_ref_base<false> *)&stack0x00000008;
  bVar1 = in_DL & 1;
  bVar2 = subtree_ref_base<false>::is_full(in_stack_fffffffffffffd10);
  if (bVar2) {
    subtree_ref::copy((subtree_ref *)&stack0xffffffffffffffc0,(EVP_PKEY_CTX *)this_00,src);
    subtree_ref_base<false>::size(this_00);
    subtree_ref_base<false>::sizes(in_stack_fffffffffffffd10);
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                 *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    subtree_ref_base<false>::rank(this_00);
    subtree_ref_base<false>::ranks(in_stack_fffffffffffffd10);
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                 *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    subtree_ref_base<false>::pointers(in_stack_fffffffffffffd10);
    __s = (char *)0x0;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                 *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    subtree_ref_base<false>::index((subtree_ref_base<false> *)&stack0xffffffffffffffc0,__s,__c);
    subtree_ref_base<false>::pointers(in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
    item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                 *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 1;
    root(in_stack_fffffffffffffd00);
    insert(in_RSI,(subtree_ref)in_stack_00000000,CONCAT17(bVar1,in_stack_ffffffffffffffe8),
           (bool)in_stack_ffffffffffffffe7);
  }
  else {
    bVar2 = subtree_ref_base<false>::is_leaf(this_00);
    if (bVar2) {
      *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
      *(ulong *)(in_RDI + 0x48) = (ulong)(bVar1 & 1) + *(long *)(in_RDI + 0x48);
      subtree_ref_base<false>::leaf((subtree_ref_base<false> *)0x151e41);
      bitview<bv::internal::bitarray_t<4096UL>::array>::insert
                (in_stack_fffffffffffffd60,in_RDI,SUB81((ulong)this_00 >> 0x38,0));
    }
    else {
      subtree_ref_base<false>::find_insert_point
                ((subtree_ref_base<false> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      std::tie<unsigned_long,unsigned_long>
                (&in_stack_fffffffffffffd08->first,&in_stack_fffffffffffffd00->capacity);
      std::tuple<unsigned_long&,unsigned_long&>::operator=
                ((tuple<unsigned_long_&,_unsigned_long_&> *)in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffd08);
      subtree_ref_base<false>::child(in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
      bVar2 = subtree_ref_base<false>::is_full(in_stack_fffffffffffffd10);
      if (bVar2) {
        internal::bt_impl::subtree_ref::operator_cast_to_subtree_ref_base
                  ((subtree_ref *)in_stack_fffffffffffffd00);
        t_01._index = in_stack_fffffffffffffe28;
        t_01._vector = (bt_impl_t *)in_stack_fffffffffffffe20;
        t_01._height = (size_t)in_stack_fffffffffffffe30;
        t_01._size = (size_t)in_stack_fffffffffffffe38;
        t_01._rank = (size_t)in_stack_fffffffffffffe40;
        find_adjacent_children(in_stack_fffffffffffffe08,t_01,in_stack_fffffffffffffe00);
        std::tie<unsigned_long,unsigned_long,unsigned_long>
                  (puStack_160,(unsigned_long *)ptStack_168,(unsigned_long *)local_170);
        std::tuple<unsigned_long&,unsigned_long&,unsigned_long&>::operator=(ptStack_168,local_170);
        memcpy(&stack0xfffffffffffffe50,this_00,0x28);
        t_00.super_subtree_ref_base<false>._index = local_190;
        t_00.super_subtree_ref_base<false>._vector = (bt_impl_t *)uStack_198;
        t_00.super_subtree_ref_base<false>._height = (size_t)in_stack_fffffffffffffd20;
        t_00.super_subtree_ref_base<false>._size = in_stack_fffffffffffffd28;
        t_00.super_subtree_ref_base<false>._rank = local_130;
        sVar3 = split_limit(pbStack_1a8,t_00);
        in_stack_fffffffffffffcf8 = in_stack_fffffffffffffe28;
        in_stack_fffffffffffffd00 = in_stack_fffffffffffffe30;
        in_stack_fffffffffffffd18 = in_stack_fffffffffffffe48;
        if (sVar3 <= local_130) {
          subtree_ref::insert_child(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
          in_stack_fffffffffffffcf8 = in_stack_fffffffffffffe28;
          in_stack_fffffffffffffd00 = in_stack_fffffffffffffe30;
          in_stack_fffffffffffffd18 = in_stack_fffffffffffffe48;
        }
        memcpy(&stack0xfffffffffffffe28,this_00,0x28);
        redistribute(in_stack_fffffffffffffd90,(subtree_ref)in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        subtree_ref_base<false>::find_insert_point
                  ((subtree_ref_base<false> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        std::tie<unsigned_long,unsigned_long>
                  (&in_stack_fffffffffffffe38->first,&in_stack_fffffffffffffd00->capacity);
        std::tuple<unsigned_long&,unsigned_long&>::operator=
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      }
      subtree_ref_base<false>::child(in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
      subtree_ref::subtree_ref(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      subtree_ref_base<false>::sizes(this_00,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
      ::operator+=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                    *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      subtree_ref_base<false>::ranks(this_00,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
      ::operator+=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                    *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      memcpy(&stack0xfffffffffffffd60,local_220,0x28);
      insert(in_RSI,(subtree_ref)in_stack_00000000,CONCAT17(bVar1,in_stack_ffffffffffffffe8),
             (bool)in_stack_ffffffffffffffe7);
    }
  }
  return;
}

Assistant:

void bt_impl<W, AP>::insert(subtree_ref t, size_t index, bool bit)
        {
            assert(index <= t.size() && "Index out of bounds");
            assert(size < capacity);
            
            // If we see a full node in this point it must be the root,
            // otherwise we've violated our invariants.
            // So, since it's a root and it's full, we prepare the split
            // by allocating a new node and swapping it with the old root,
            // thus ensuring the root is always at index zero.
            // Then we go ahead pretending we started the insertion from the
            // new root, so we don't duplicate the node splitting code
            // below
            // In small mode this should not happen, since this means that
            // the whole bitvector is full and we can't insert anything at all.
            if(t.is_full())
            {
                assert(t.is_root());
                assert(!small());
                
                // Copy the old root into another node
                subtree_ref old_root = t.copy();
                
                // Empty the root and make it point to the old one
                t.sizes() = t.size();
                t.ranks() = t.rank();
                t.pointers() = 0;
                t.pointers(0) = old_root.index();
                
                // The only point in the algorithm were the height increases
                ++height;
                
                assert(root().nchildren() == 1);
                assert(root().child(0).is_full());
                
                // Pretend we were inserting from the new root
                return insert(root(), index, bit);
            }
            
            // Hereafter we assume the node is not full
            
            // If we're inserting into a leaf, it's very simple.
            if(t.is_leaf())
            {
                // 1 - Update the counters
                size += 1;
                rank += bit;
                
                // 2 - Insert the bit
                return t.leaf().insert(index, bit);
            }
            
            // Else, we are in an internal node

            // 1 - Find where we have to insert this bit
            size_t child, new_index;
            tie(child, new_index) = t.find_insert_point(index);
            
            // 2 - Check if we need a split and/or a redistribution of bits
            if(t.child(child).is_full())
            {
                // 2.1 - Find the range of children that will be the target
                //       of the redistribution
                size_t begin, end, count;
                tie(begin, end, count) = find_adjacent_children(t, child);
                
                // 2.2 - Check if we need to split or only to redistribute
                if(count >= split_limit(t))
                    t.insert_child(end++);
                
                // 2.3 - Redistribute
                redistribute(t, begin, end, count);
                
                // 2.4 - Search again where to insert the bit
                tie(child, new_index) = t.find_insert_point(index);
            }
            
            // 3 - Get the ref to the child into which we're going to recurse,
            //     Note that we need to get the ref before incrementing the
            //     counters in the parent, for consistency
            subtree_ref child_ref = t.child(child);
            
            // 4 - Update counters
            t.sizes(child, degree) += 1;
            t.ranks(child, degree) += bit;
            
            // 5 - Insert recursively
            return insert(child_ref, new_index, bit);
        }